

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O3

void __thiscall duckdb::Bit::BitToNumeric<int>(Bit *this,bitstring_t bit,int *output_num)

{
  uint8_t uVar1;
  undefined4 *puVar2;
  ulong uVar3;
  char *pcVar4;
  anon_union_16_2_67f50693_for_value local_30;
  
  puVar2 = bit.value._8_8_;
  *puVar2 = 0;
  uVar3 = (ulong)this & 0xffffffff;
  local_30._0_8_ = this;
  local_30.pointer.ptr = bit.value._0_8_;
  uVar1 = GetFirstByte((bitstring_t *)&local_30.pointer);
  *(uint8_t *)((long)puVar2 + (uVar3 - 2)) = uVar1;
  if (6 - uVar3 < 4) {
    pcVar4 = bit.value._0_8_;
    if ((uint)this < 0xd) {
      pcVar4 = local_30.pointer.prefix;
    }
    pcVar4 = pcVar4 + 2;
    do {
      *(char *)((long)puVar2 + (uVar3 - 3)) = *pcVar4;
      uVar3 = uVar3 - 1;
      pcVar4 = pcVar4 + 1;
    } while (uVar3 != 2);
  }
  return;
}

Assistant:

void Bit::BitToNumeric(bitstring_t bit, T &output_num) {
	D_ASSERT(bit.GetSize() <= sizeof(T) + 1);

	output_num = 0;
	auto data = const_data_ptr_cast(bit.GetData());
	auto output = data_ptr_cast(&output_num);

	idx_t padded_byte_idx = sizeof(T) - bit.GetSize() + 1;
	output[sizeof(T) - 1 - padded_byte_idx] = GetFirstByte(bit);
	for (idx_t idx = padded_byte_idx + 1; idx < sizeof(T); ++idx) {
		output[sizeof(T) - 1 - idx] = data[1 + idx - padded_byte_idx];
	}
}